

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O3

void test_divceil<std::vector<unsigned_long,std::allocator<unsigned_long>>,long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *values,long divisor,
               size_t attempt_count)

{
  Integer<unsigned_long> *pIVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  Integer<unsigned_long> *pIVar5;
  size_t sVar6;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  if (attempt_count != 0) {
    sVar6 = 0;
    do {
      pIVar1 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pIVar5 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start; pIVar5 != pIVar1; pIVar5 = pIVar5 + 1)
      {
        burst::divceil<unsigned_long,long>(*pIVar5,divisor);
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != attempt_count);
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_1f098,0xc)
  ;
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}